

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall BuildTestConsole::Run(BuildTestConsole *this)

{
  Test *pTVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  Node *pNVar5;
  size_type sVar6;
  allocator<char> local_c1;
  string local_c0;
  undefined1 local_a0 [8];
  string err;
  string local_78;
  allocator<char> local_41;
  string local_40;
  ManifestParserOptions local_1c;
  int local_14;
  BuildTestConsole *pBStack_10;
  int fail_count;
  BuildTestConsole *this_local;
  
  pBStack_10 = this;
  local_14 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions(&local_1c);
  AssertParse(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_,
              "rule console\n  command = console\n  pool = console\nbuild cons: console in.txt\n",
              local_1c);
  iVar2 = local_14;
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  if (iVar2 == iVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"in.txt",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"",(allocator<char> *)(err.field_2._M_local_buf + 0xf));
    VirtualFileSystem::Create(&(this->super_BuildTest).fs_,&local_40,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)(err.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::__cxx11::string::string((string *)local_a0);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"cons",&local_c1);
    pNVar5 = Builder::AddTarget(&(this->super_BuildTest).builder_,&local_c0,(string *)local_a0);
    testing::Test::Check
              (pTVar1,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0xb74,"builder_.AddTarget(\"cons\", &err)");
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator(&local_c1);
    pTVar1 = g_current_test;
    bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_a0);
    bVar3 = testing::Test::Check
                      (pTVar1,bVar3,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                       ,0xb75,"\"\" == err");
    pTVar1 = g_current_test;
    if (bVar3) {
      bVar3 = Builder::Build(&(this->super_BuildTest).builder_,(string *)local_a0);
      testing::Test::Check
                (pTVar1,bVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                 ,0xb76,"builder_.Build(&err)");
      pTVar1 = g_current_test;
      bVar3 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_a0);
      testing::Test::Check
                (pTVar1,bVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                 ,0xb77,"\"\" == err");
      pTVar1 = g_current_test;
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&(this->super_BuildTest).command_runner_.commands_ran_);
      bVar3 = testing::Test::Check
                        (pTVar1,sVar6 == 1,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
                         ,0xb78,"1u == command_runner_.commands_ran_.size()");
      if (!bVar3) {
        testing::Test::AddAssertionFailure(g_current_test);
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
    std::__cxx11::string::~string((string *)local_a0);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(BuildTest, Console) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule console\n"
"  command = console\n"
"  pool = console\n"
"build cons: console in.txt\n"));

  fs_.Create("in.txt", "");

  string err;
  EXPECT_TRUE(builder_.AddTarget("cons", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ("", err);
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());
}